

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int uECC_shared_secret(uint8_t *public_key,uint8_t *private_key,uint8_t *secret,uECC_Curve curve)

{
  char cVar1;
  char cVar2;
  int iVar3;
  uECC_word_t uVar4;
  byte bVar5;
  int iVar6;
  uECC_word_t *random;
  uint uVar7;
  ulong uVar8;
  bitcount_t bVar9;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar10 [16];
  uECC_word_t *p2 [2];
  uECC_word_t _public [8];
  uECC_word_t tmp [4];
  uECC_word_t _private [4];
  uECC_word_t *local_d8 [3];
  long local_c0;
  undefined8 local_b8;
  uint auStack_b0 [14];
  uECC_word_t local_78 [4];
  uECC_word_t local_58 [5];
  
  local_d8[0] = local_58;
  local_d8[1] = local_78;
  cVar1 = curve->num_words;
  cVar2 = curve->num_bytes;
  bVar9 = curve->num_n_bits;
  iVar3 = bVar9 + 7;
  iVar6 = bVar9 + 0xe;
  if (-1 < iVar3) {
    iVar6 = iVar3;
  }
  uECC_vli_bytesToNative(local_d8[0],private_key,iVar6 >> 3);
  uECC_vli_bytesToNative(&local_b8,public_key,(int)cVar2);
  local_c0 = (long)cVar1;
  uECC_vli_bytesToNative(&local_b8 + cVar1,public_key + cVar2,(int)cVar2);
  uVar4 = regularize_k(local_58,local_58,local_78,curve);
  if (g_rng_function == (uECC_RNG_Function)0x0) {
    random = (uECC_word_t *)0x0;
  }
  else {
    random = local_d8[uVar4];
    iVar3 = uECC_generate_random_int(random,curve->p,(wordcount_t)local_c0);
    if (iVar3 == 0) {
      return 0;
    }
    bVar9 = curve->num_n_bits;
  }
  EccPoint_mult(&local_b8,&local_b8,local_d8[uVar4 ^ 1],random,bVar9 + 1,curve);
  if ('\0' < cVar2) {
    bVar5 = cVar2 * '\b';
    uVar7 = (uint)cVar2;
    uVar8 = 0;
    do {
      uVar7 = uVar7 - 1;
      bVar5 = bVar5 - 8;
      secret[uVar8] =
           (uint8_t)(*(ulong *)((long)&local_b8 + (ulong)(uVar7 & 0xfffffff8)) >> (bVar5 & 0x38));
      uVar8 = uVar8 + 1;
    } while (uVar8 != ((long)cVar2 & 0xffffffffU));
  }
  bVar5 = curve->num_words * '\x02';
  uVar7 = 0;
  if ('\0' < (char)bVar5) {
    uVar7 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    uVar8 = 0;
    do {
      uVar7 = uVar7 | *(uint *)(&local_b8 + uVar8);
      uVar11 = uVar11 | auStack_b0[uVar8 * 2 + -1];
      uVar12 = uVar12 | (uint)local_78[uVar8 - 7];
      uVar13 = uVar13 | *(uint *)((long)local_78 + uVar8 * 8 + -0x34);
      uVar8 = uVar8 + 2;
    } while (bVar5 != uVar8);
    auVar10._0_4_ = -(uint)(uVar7 == 0);
    auVar10._4_4_ = -(uint)(uVar11 == 0);
    auVar10._8_4_ = -(uint)(uVar12 == 0);
    auVar10._12_4_ = -(uint)(uVar13 == 0);
    iVar3 = movmskps((int)uVar8,auVar10);
    uVar7 = (uint)(iVar3 != 0xf);
  }
  return uVar7;
}

Assistant:

int uECC_shared_secret(const uint8_t *public_key,
                       const uint8_t *private_key,
                       uint8_t *secret,
                       uECC_Curve curve) {
    uECC_word_t _public[uECC_MAX_WORDS * 2];
    uECC_word_t _private[uECC_MAX_WORDS];

    uECC_word_t tmp[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {_private, tmp};
    uECC_word_t *initial_Z = 0;
    uECC_word_t carry;
    wordcount_t num_words = curve->num_words;
    wordcount_t num_bytes = curve->num_bytes;

#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) _private, private_key, num_bytes);
    bcopy((uint8_t *) _public, public_key, num_bytes*2);
#else
    uECC_vli_bytesToNative(_private, private_key, BITS_TO_BYTES(curve->num_n_bits));
    uECC_vli_bytesToNative(_public, public_key, num_bytes);
    uECC_vli_bytesToNative(_public + num_words, public_key + num_bytes, num_bytes);
#endif

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(_private, _private, tmp, curve);

    /* If an RNG function was specified, try to get a random initial Z value to improve
       protection against side-channel attacks. */
    if (g_rng_function) {
        if (!uECC_generate_random_int(p2[carry], curve->p, num_words)) {
            return 0;
        }
        initial_Z = p2[carry];
    }

    EccPoint_mult(_public, _public, p2[!carry], initial_Z, curve->num_n_bits + 1, curve);
#if uECC_VLI_NATIVE_LITTLE_ENDIAN
    bcopy((uint8_t *) secret, (uint8_t *) _public, num_bytes);
#else
    uECC_vli_nativeToBytes(secret, num_bytes, _public);
#endif
    return !EccPoint_isZero(_public, curve);
}